

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct::forward(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  size_t sVar6;
  float *pfVar7;
  void *pvVar8;
  size_t sVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  void *pvVar13;
  void *pvVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  float fVar19;
  
  if ((opt->use_int8_inference == true) && ((this->weight_data).elemsize == 1)) {
    iVar10 = (*(this->super_Layer)._vptr_Layer[10])(this,bottom_blob,top_blob);
    return iVar10;
  }
  iVar10 = bottom_blob->w;
  iVar1 = bottom_blob->h;
  uVar2 = bottom_blob->c;
  Mat::create(top_blob,this->num_output,bottom_blob->elemsize,opt->blob_allocator);
  iVar11 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    iVar11 = this->num_output;
    if (0 < (long)iVar11) {
      uVar17 = iVar1 * iVar10;
      iVar10 = this->bias_term;
      iVar1 = this->activation_type;
      pvVar3 = (this->bias_data).data;
      pvVar4 = (this->weight_data).data;
      pvVar5 = bottom_blob->data;
      sVar6 = bottom_blob->cstep;
      pfVar7 = (float *)(this->activation_params).data;
      pvVar8 = top_blob->data;
      sVar9 = bottom_blob->elemsize;
      iVar12 = 0;
      lVar16 = 0;
      do {
        fVar19 = 0.0;
        if (iVar10 != 0) {
          fVar19 = *(float *)((long)pvVar3 + lVar16 * 4);
        }
        if (0 < (int)uVar2) {
          pvVar13 = (void *)((long)pvVar4 + (long)iVar12 * 4);
          uVar15 = 0;
          pvVar14 = pvVar5;
          do {
            if (0 < (int)uVar17) {
              uVar18 = 0;
              do {
                fVar19 = fVar19 + *(float *)((long)pvVar13 + uVar18 * 4) *
                                  *(float *)((long)pvVar14 + uVar18 * 4);
                uVar18 = uVar18 + 1;
              } while (uVar17 != uVar18);
            }
            uVar15 = uVar15 + 1;
            pvVar13 = (void *)((long)pvVar13 + (long)(int)uVar17 * 4);
            pvVar14 = (void *)((long)pvVar14 + sVar6 * sVar9);
          } while (uVar15 != uVar2);
        }
        switch(iVar1) {
        case 1:
          if (fVar19 <= 0.0) {
            fVar19 = 0.0;
          }
          break;
        case 2:
          fVar19 = fVar19 * (float)(~-(uint)(0.0 < fVar19) & (uint)*pfVar7 |
                                   -(uint)(0.0 < fVar19) & 0x3f800000);
          break;
        case 3:
          if (fVar19 <= *pfVar7) {
            fVar19 = *pfVar7;
          }
          if (pfVar7[1] < fVar19) {
            fVar19 = pfVar7[1];
          }
          break;
        case 4:
          fVar19 = expf(-fVar19);
          fVar19 = 1.0 / (fVar19 + 1.0);
        }
        *(float *)((long)pvVar8 + lVar16 * 4) = fVar19;
        lVar16 = lVar16 + 1;
        iVar12 = iVar12 + uVar17 * uVar2;
      } while (lVar16 != iVar11);
    }
    iVar11 = 0;
  }
  return iVar11;
}

Assistant:

int InnerProduct::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float sum = 0.f;

        if (bias_term)
            sum = bias_data[p];

        // channels
        for (int q=0; q<channels; q++)
        {
            const float* w = (const float*)weight_data + size * channels * p + size * q;
            const float* m = bottom_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        if (activation_type == 1)
        {
            sum = std::max(sum, 0.f);
        }
        else if (activation_type == 2)
        {
            float slope = activation_params[0];
            sum = sum > 0.f ? sum : sum * slope;
        }
        else if (activation_type == 3)
        {
            float min = activation_params[0];
            float max = activation_params[1];
            if (sum < min)
                sum = min;
            if (sum > max)
                sum = max;
        }
        else if (activation_type == 4)
        {
            sum = static_cast<float>(1.f / (1.f + exp(-sum)));
        }

        top_blob[p] = sum;
    }

    return 0;
}